

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O0

QSslDiffieHellmanParameters
QSslDiffieHellmanParameters::fromEncoded(QByteArray *encoded,EncodingFormat encoding)

{
  QTlsBackend *pQVar1;
  int in_EDX;
  QSslDiffieHellmanParametersPrivate *in_RDI;
  QTlsBackend *tlsBackend;
  QSslDiffieHellmanParameters *result;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QSslDiffieHellmanParametersPrivate *this;
  
  in_RDI->super_QSharedData = (QAtomicInt)0xaaaaaaaa;
  in_RDI->error = 0xaaaaaaaa;
  this = in_RDI;
  QSslDiffieHellmanParameters
            ((QSslDiffieHellmanParameters *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pQVar1 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar1 != (QTlsBackend *)0x0) {
    if (in_EDX == 0) {
      QSslDiffieHellmanParametersPrivate::initFromPem(this,(QByteArray *)in_RDI);
    }
    else if (in_EDX == 1) {
      QSslDiffieHellmanParametersPrivate::initFromDer(this,(QByteArray *)in_RDI);
    }
  }
  return (QSslDiffieHellmanParameters)this;
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(const QByteArray &encoded, QSsl::EncodingFormat encoding)
{
    QSslDiffieHellmanParameters result;
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend)
        return result;
    switch (encoding) {
    case QSsl::Der:
        result.d->initFromDer(encoded);
        break;
    case QSsl::Pem:
        result.d->initFromPem(encoded);
        break;
    }
    return result;
}